

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::FakeLoaderCallback::load
          (FakeLoaderCallback *this,SchemaLoader *loader,uint64_t id)

{
  bool bVar1;
  bool local_6b;
  bool local_6a;
  DebugExpression<bool> local_69;
  bool _kj_shouldLog_1;
  uint64_t uStack_68;
  DebugExpression<bool> _kjCondition_1;
  bool local_59;
  uint64_t uStack_58;
  bool _kj_shouldLog;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  uint64_t id_local;
  SchemaLoader *loader_local;
  FakeLoaderCallback *this_local;
  
  if (id != 0x4d2) {
    _kjCondition._32_8_ = id;
    uStack_58 = capnp::schema::Node::Reader::getId(&this->node);
    local_50 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffa8);
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_48,&local_50,
               (unsigned_long *)&_kjCondition.result);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
    if (!bVar1) {
      local_59 = kj::_::Debug::shouldLog(ERROR);
      while (local_59 != false) {
        uStack_68 = capnp::schema::Node::Reader::getId(&this->node);
        kj::_::Debug::
        log<char_const(&)[40],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,unsigned_long,unsigned_long&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0x11f,ERROR,
                   "\"failed: expected \" \"(node.getId()) == (id)\", _kjCondition, node.getId(), id"
                   ,(char (*) [40])"failed: expected (node.getId()) == (id)",
                   (DebugComparison<unsigned_long,_unsigned_long_&> *)local_48,
                   &stack0xffffffffffffff98,(unsigned_long *)&_kjCondition.result);
        local_59 = false;
      }
    }
    local_6a = (bool)((this->loaded ^ 0xffU) & 1);
    local_69 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_6a);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_69);
    if (!bVar1) {
      local_6b = kj::_::Debug::shouldLog(ERROR);
      while (local_6b != false) {
        kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0x120,ERROR,"\"failed: expected \" \"!(loaded)\", _kjCondition",
                   (char (*) [27])"failed: expected !(loaded)",&local_69);
        local_6b = false;
      }
    }
    this->loaded = true;
    SchemaLoader::loadOnce(loader,&this->node);
  }
  return;
}

Assistant:

void load(const SchemaLoader& loader, uint64_t id) const override {
    if (id == 1234) {
      // Magic "not found" ID.
      return;
    }

    EXPECT_EQ(node.getId(), id);
    EXPECT_FALSE(loaded);
    loaded = true;
    loader.loadOnce(node);
  }